

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-wilderness.c
# Opt level: O0

chunk_conflict * swamp_gen(player *p,wchar_t height,wchar_t width,char **p_error)

{
  short sVar1;
  loc_conflict grid_00;
  loc_conflict grid_01;
  loc grid2;
  loc_conflict grid_02;
  loc_conflict grid_03;
  loc grid_04;
  loc_conflict grid_05;
  _Bool _Var2;
  uint32_t uVar3;
  uint32_t uVar4;
  wchar_t wVar5;
  feature *pfVar6;
  chunk_conflict *c;
  wchar_t form_feats [7];
  wchar_t form_grids;
  wchar_t last_place;
  wchar_t place;
  loc grid;
  char **p_error_local;
  wchar_t width_local;
  wchar_t height_local;
  player *p_local;
  
  sVar1 = p->place;
  form_feats[6] = (wchar_t)p->last_place;
  form_feats[5] = L'\0';
  c._0_4_ = FEAT_TREE;
  c._4_4_ = FEAT_PASS_RUBBLE;
  form_feats[0] = FEAT_MAGMA;
  form_feats[1] = FEAT_GRANITE;
  form_feats[2] = FEAT_TREE2;
  form_feats[3] = FEAT_QUARTZ;
  form_feats[4] = FEAT_NONE;
  p_local = (player *)cave_new((uint)z_info->dungeon_hgt,(uint)z_info->dungeon_wid);
  *(int *)((long)&p_local->class + 4) = (int)p->depth;
  (p_local->grid).x = (int)sVar1;
  for (place = L'\0'; place < *(wchar_t *)&p_local->ht; place = place + L'\x01') {
    for (last_place = L'\0'; last_place < p_local->au; last_place = last_place + L'\x01') {
      grid_00.y = place;
      grid_00.x = last_place;
      square_set_feat((chunk *)p_local,grid_00,FEAT_GRASS);
    }
  }
  alloc_paths((chunk_conflict *)p_local,p,(int)sVar1,form_feats[6]);
  set_num_vaults((chunk_conflict *)p_local);
  make_edges((chunk_conflict *)p_local,true,false);
  for (place = L'\x01'; place < *(wchar_t *)&p_local->ht + L'\xffffffff'; place = place + L'\x01') {
    for (last_place = L'\x02'; last_place < p_local->au + L'\xffffffff';
        last_place = last_place + L'\x01') {
      grid_01.y = place;
      grid_01.x = last_place;
      pfVar6 = square_feat((chunk *)p_local,grid_01);
      _Var2 = feat_is_permanent(pfVar6->fidx);
      if (!_Var2) {
        grid2.y = place;
        grid2.x = last_place;
        _Var2 = loc_eq(p->grid,grid2);
        if ((_Var2) || (uVar3 = Rand_div(100), (int)uVar3 < 0x32)) {
          grid_02.y = place;
          grid_02.x = last_place;
          square_set_feat((chunk *)p_local,grid_02,FEAT_GRASS);
        }
        else {
          grid_03.y = place;
          grid_03.x = last_place;
          square_set_feat((chunk *)p_local,grid_03,FEAT_WATER);
        }
      }
    }
  }
  for (; form_feats[5] < (wchar_t)(20000 / (long)*(wchar_t *)((long)&p_local->class + 4));
      form_feats[5] = wVar5 + form_feats[5]) {
    uVar3 = Rand_div(*(wchar_t *)&p_local->ht + L'\xfffffffe');
    uVar4 = Rand_div(p_local->au + L'\xfffffffe');
    grid_04.y = uVar3 + 1;
    grid_04.x = uVar4 + 1;
    wVar5 = make_formation((chunk_conflict *)p_local,p,grid_04,FEAT_GRASS,FEAT_WATER,(int *)&c,
                           "Swamp",*(wchar_t *)((long)&p_local->class + 4));
  }
  for (place = L'\0'; place < *(wchar_t *)&p_local->ht; place = place + L'\x01') {
    for (last_place = L'\0'; last_place < p_local->au; last_place = last_place + L'\x01') {
      grid_05.y = place;
      grid_05.x = last_place;
      square_unmark((chunk *)p_local,grid_05);
    }
  }
  populate((chunk_conflict *)p_local,false);
  _Var2 = verify_level((chunk_conflict *)p_local);
  if (!_Var2) {
    wipe_mon_list((chunk *)p_local,p);
    cave_free((chunk_conflict *)p_local);
    *p_error = "wilderness level had generation issues";
    p_local = (player *)0x0;
  }
  return (chunk_conflict *)p_local;
}

Assistant:

struct chunk *swamp_gen(struct player *p, int height, int width,
						const char **p_error)
{
	struct loc grid;
	int place = p->place;
	int last_place = p->last_place;
	int form_grids = 0;

	int form_feats[] = { FEAT_TREE, FEAT_PASS_RUBBLE, FEAT_MAGMA, FEAT_GRANITE,
						 FEAT_TREE2, FEAT_QUARTZ, FEAT_NONE };

    /* Make the level */
    struct chunk *c = cave_new(z_info->dungeon_hgt, z_info->dungeon_wid);
	c->depth = p->depth;
	c->place = place;

	/* Start with grass */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_set_feat(c, grid, FEAT_GRASS);
		}
	}

	/* Place 2 or 3 paths to neighbouring places, place player -NRM- */
	alloc_paths(c, p, place, last_place);

	/* Set the number of wilderness vaults */
	set_num_vaults(c);

	/* Make place boundaries */
	make_edges(c, true, false);

	/* Add water */
	for (grid.y = 1; grid.y < c->height - 1; grid.y++) {
		for (grid.x = 2; grid.x < c->width - 1; grid.x++) {
			if (feat_is_permanent(square_feat(c, grid)->fidx))
				continue;
			if (loc_eq(p->grid, grid) || (randint0(100) < 50)) {
				square_set_feat(c, grid, FEAT_GRASS);
			} else {
				square_set_feat(c, grid, FEAT_WATER);
			}
		}
	}

	/* Place some formations (but not many, and less for more danger) */
	while (form_grids < 20000 / c->depth) {
		/* Choose a place */
		grid.y = randint1(c->height - 2);
		grid.x = randint1(c->width - 2);
		form_grids += make_formation(c, p, grid, FEAT_GRASS, FEAT_WATER,
									 form_feats, "Swamp", c->depth);
	}

	/* Unmark squares */
	for (grid.y = 0; grid.y < c->height; grid.y++) {
		for (grid.x = 0; grid.x < c->width; grid.x++) {
			square_unmark(c, grid);
		}
	}

	/* Place objects, traps and monsters */
	(void) populate(c, false);

	if (!verify_level(c)) {
		wipe_mon_list(c, p);
		cave_free(c);
		*p_error = "wilderness level had generation issues";
		return NULL;
	}

	return c;
}